

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

char * get_cache_basedir(char **extra)

{
  char *base;
  char **extra_local;
  
  *extra = "";
  extra_local = (char **)getenv("XDG_CACHE_HOME");
  if ((extra_local == (char **)0x0) || (*(char *)extra_local == '\0')) {
    extra_local = (char **)getenv("HOME");
    if ((extra_local == (char **)0x0) || (*(char *)extra_local == '\0')) {
      extra_local = (char **)getenv("TMPDIR");
      if (((extra_local == (char **)0x0) || (*(char *)extra_local == '\0')) &&
         ((extra_local = (char **)getenv("TEMP"), extra_local == (char **)0x0 ||
          (*(char *)extra_local == '\0')))) {
        extra_local = (char **)anon_var_dwarf_d83f;
      }
    }
    else {
      *extra = "/.cache";
    }
  }
  return (char *)extra_local;
}

Assistant:

static const char *get_cache_basedir(const char **extra) {
    char *base;

    *extra = "";

    base = getenv("XDG_CACHE_HOME");
    if (base && *base) return base;

    base = getenv("HOME");
    if (base && *base) { *extra = "/.cache"; return base; }

    base = getenv("TMPDIR");
    if (base && *base) return base;

    base = getenv("TEMP");
    if (base && *base) return base;

    return "/tmp";
}